

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O1

char * fmt_time(double sec)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  fmt_time::ts[0] = '\0';
  uVar3 = (uint)(long)sec;
  uVar4 = (long)sec & 0xffffffff;
  iVar1 = (int)(uVar4 / 0x3c);
  uVar5 = iVar1 + (int)(uVar4 / 0xe10) * -0x3c;
  if (0xe0f < uVar3) {
    snprintf(fmt_time::ts,4,"%02u:",uVar4 / 0xe10);
  }
  if (uVar5 != 0) {
    sVar2 = strlen(fmt_time::ts);
    snprintf(fmt_time::ts + sVar2,4,"%02u:",(ulong)uVar5);
  }
  sVar2 = strlen(fmt_time::ts);
  iVar1 = snprintf(fmt_time::ts + sVar2,7,"%02u.%03u",(ulong)(uVar3 + iVar1 * -0x3c),
                   (long)((sec - (double)uVar4) * 1000.0));
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static const char *
fmt_time(double sec) {
    static char ts[256];
    unsigned int i_sec;
    unsigned int i_min;
    unsigned int i_hour;

    ts[0] = '\0';

    i_sec = (unsigned int)sec;
    i_min = i_sec / 60;
    i_sec = i_sec % 60;
    i_hour = i_min / 60;
    i_min = i_min % 60;

    if(i_hour > 0) {
        snprintf(ts,4,"%02u:",i_hour);
    }
    if(i_min > 0) {
        snprintf(&ts[strlen(ts)],4,"%02u:",i_min);
    }
    snprintf(&ts[strlen(ts)],7,"%02u.%03u",i_sec, (unsigned int)((sec - (unsigned int)sec) * 1000));

    return (const char *)ts;
}